

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

string * full_ident_name_abi_cxx11_
                   (string *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *tokens,
                   int begin_index)

{
  int iVar1;
  pointer pTVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  allocator local_71;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start[begin_index].u.s,(allocator *)&local_70);
  if (0 < begin_index) {
    lVar5 = (ulong)(uint)begin_index + 1;
    lVar6 = (ulong)(uint)begin_index * 0x18 + -8;
    do {
      pTVar2 = (tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = *(int *)((long)pTVar2 + lVar6 + -0x10);
      if (iVar1 == 2) {
        std::__cxx11::string::string
                  ((string *)local_50,*(char **)((long)&pTVar2->type + lVar6),&local_71);
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_50,
                                    (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      else {
        if ((iVar1 != 0x35) && (iVar1 != 9)) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
      }
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x18;
    } while (1 < lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string full_ident_name(const std::vector<Token> & tokens, int begin_index)
{
  string res = tokens[begin_index].u.s;
  for (int i = begin_index - 1; i >= 0; i--)
  {
    if (tokens[i].type == TK_DOT || tokens[i].type == TK_NULLGETSTR)
      res.insert(res.begin(), '.');
    else if (tokens[i].type == TK_IDENTIFIER)
      res = string(tokens[i].u.s) + res;
    else
      break;
  }
  return res;
}